

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

MainBuilder * __thiscall
kj::MainBuilder::addOptionWithArg
          (MainBuilder *this,initializer_list<kj::MainBuilder::OptionName> names,
          Function<kj::MainBuilder::Validity_(kj::StringPtr)> *callback,StringPtr argumentTitle,
          StringPtr helpText)

{
  Option *pOVar1;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> *pFVar2;
  
  pOVar1 = Impl::addOption((this->impl).ptr,names,true,helpText);
  pFVar2 = Arena::
           allocate<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>,kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>>
                     (&((this->impl).ptr)->arena,callback);
  (pOVar1->field_2).funcWithArg = pFVar2;
  (pOVar1->argTitle).content.ptr = argumentTitle.content.ptr;
  (pOVar1->argTitle).content.size_ = argumentTitle.content.size_;
  return this;
}

Assistant:

MainBuilder& MainBuilder::addOptionWithArg(std::initializer_list<OptionName> names,
                                           Function<Validity(StringPtr)> callback,
                                           StringPtr argumentTitle, StringPtr helpText) {
  auto& opt = impl->addOption(names, true, helpText);
  opt.funcWithArg = &impl->arena.copy(kj::mv(callback));
  opt.argTitle = argumentTitle;
  return *this;
}